

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

HierarchicalReferenceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::HierarchicalReferenceExpression,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Symbol *args,Type *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  HierarchicalReferenceExpression *pHVar3;
  
  pHVar3 = (HierarchicalReferenceExpression *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchicalReferenceExpression *)this->endPtr < pHVar3 + 1) {
    pHVar3 = (HierarchicalReferenceExpression *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pHVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pHVar3->super_Expression).kind = HierarchicalReference;
  (pHVar3->super_Expression).type.ptr = args_1;
  (pHVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pHVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pHVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pHVar3->super_Expression).sourceRange.endLoc = SVar2;
  (pHVar3->symbol).ptr = args;
  return pHVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }